

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ublox.h
# Opt level: O1

int GetNMEASentenceublox(UBLOX *publox,NMEADATA *pNMEAData)

{
  UBLOX *pUVar1;
  int iVar2;
  int iVar3;
  ssize_t sVar4;
  __time_t _Var5;
  long *plVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  char *pcVar10;
  char talkerid [3];
  int sentencelen;
  int nbBytesToRequest;
  char mnemonic [6];
  CHRONO chrono;
  char recvbuf [4096];
  char local_10b4 [4];
  int local_10b0;
  int local_10ac;
  timespec local_10a8;
  char local_1098 [8];
  UBLOX *local_1090;
  NMEADATA *local_1088;
  timespec local_1080;
  undefined8 local_1070;
  undefined8 uStack_1068;
  long local_1060;
  long lStack_1058;
  timespec local_1050;
  int local_1040;
  char local_1038 [4104];
  
  local_10b0 = 0;
  iVar2 = clock_getres(4,&local_1050);
  if ((iVar2 == 0) && (iVar2 = clock_gettime(4,&local_1080), iVar2 == 0)) {
    local_1040 = 0;
    local_1070 = 0;
    uStack_1068 = 0;
    local_1060 = 0;
    lStack_1058 = 0;
  }
  uVar8 = 0;
  memset(local_1038,0,0x1000);
  iVar2 = (publox->RS232Port).DevType;
  if (iVar2 - 1U < 4) {
    iVar2 = (publox->RS232Port).s;
    do {
      sVar4 = recv(iVar2,local_1038 + uVar8,(long)(3 - (int)uVar8),0);
      if ((int)sVar4 < 1) goto LAB_00118046;
      uVar7 = (int)uVar8 + (int)sVar4;
      uVar8 = (ulong)uVar7;
    } while ((int)uVar7 < 3);
  }
  else {
    if (iVar2 != 0) {
LAB_00118046:
      puts("Error reading data from a ublox. ");
      return 1;
    }
    iVar2 = *(int *)&(publox->RS232Port).hDev;
    uVar8 = 0;
    do {
      sVar4 = read(iVar2,local_1038 + uVar8,(ulong)(3 - (int)uVar8));
      if ((int)sVar4 < 1) goto LAB_00118046;
      uVar7 = (int)uVar8 + (int)sVar4;
      uVar8 = (ulong)uVar7;
    } while (uVar7 < 3);
  }
  local_1088 = pNMEAData;
  if ((publox->bSaveRawData != 0) && ((FILE *)publox->pfSaveFile != (FILE *)0x0)) {
    fwrite(local_1038,3,1,(FILE *)publox->pfSaveFile);
    fflush((FILE *)publox->pfSaveFile);
  }
  iVar2 = 3;
  local_1090 = publox;
  do {
    local_10b4[0] = '\0';
    local_10b4[1] = '\0';
    local_10b4[2] = 0;
    local_1098[0] = '\0';
    local_1098[1] = '\0';
    local_1098[2] = '\0';
    local_1098[3] = '\0';
    local_1098[4] = '\0';
    local_1098[5] = '\0';
    local_10a8.tv_sec = CONCAT44(local_10a8.tv_sec._4_4_,0xffffffff);
    local_10ac = 0;
    uVar7 = 0;
    pcVar10 = local_1038;
    do {
      iVar3 = AnalyzeSentenceNMEA(pcVar10,iVar2 - uVar7,local_10b4,local_1098,&local_10b0,
                                  (int *)&local_10a8,&local_10ac);
      uVar9 = 0xffffffff;
      if (iVar3 == 0) goto LAB_00117e25;
      if (iVar3 == 6) {
        iVar3 = 6;
        uVar9 = (uint)local_10a8.tv_sec;
        goto LAB_00117e25;
      }
      pcVar10 = pcVar10 + local_10ac;
      uVar7 = uVar7 + local_10ac;
    } while ((int)uVar7 < iVar2);
    iVar3 = 1;
    pcVar10 = (char *)0x0;
LAB_00117e25:
    if (iVar3 == 1) {
      uVar9 = 3;
      if ((int)uVar7 < 3) {
        uVar9 = uVar7;
      }
    }
    else if (iVar3 == 0) {
      if (0 < (int)(iVar2 - (uVar7 + local_10b0))) {
        puts("Warning getting data from a ublox : Unexpected data after a sentence. ");
      }
      iVar2 = ProcessSentenceNMEA(pcVar10,local_10b0,local_10b4,local_1098,local_1088);
      return (uint)(iVar2 != 0);
    }
    iVar3 = iVar2 - uVar7;
    memmove(local_1038,local_1038 + (int)uVar7,(long)iVar3);
    iVar2 = iVar3 + uVar9;
    if (0xfff < iVar2) {
      puts("Error reading data from a ublox : Invalid data. ");
      return 4;
    }
    pcVar10 = local_1038 + iVar3;
    iVar3 = (local_1090->RS232Port).DevType;
    if (iVar3 - 1U < 4) {
      if (0 < (int)uVar9) {
        iVar3 = (local_1090->RS232Port).s;
        uVar7 = 0;
        do {
          sVar4 = recv(iVar3,pcVar10 + uVar7,(long)(int)(uVar9 - uVar7),0);
          if ((int)sVar4 < 1) goto LAB_00118046;
          uVar7 = uVar7 + (int)sVar4;
        } while ((int)uVar7 < (int)uVar9);
      }
    }
    else {
      if (iVar3 != 0) goto LAB_00118046;
      if (uVar9 != 0) {
        iVar3 = *(int *)&(local_1090->RS232Port).hDev;
        uVar7 = 0;
        do {
          sVar4 = read(iVar3,pcVar10 + uVar7,(ulong)(uVar9 - uVar7));
          if ((int)sVar4 < 1) goto LAB_00118046;
          uVar7 = uVar7 + (int)sVar4;
        } while (uVar7 < uVar9);
      }
    }
    pUVar1 = local_1090;
    if ((local_1090->bSaveRawData != 0) && ((FILE *)local_1090->pfSaveFile != (FILE *)0x0)) {
      fwrite(pcVar10,(long)(int)uVar9,1,(FILE *)local_1090->pfSaveFile);
      fflush((FILE *)pUVar1->pfSaveFile);
    }
    if (local_1040 == 0) {
      clock_gettime(4,&local_10a8);
      local_10a8.tv_sec =
           (local_10a8.tv_sec + local_1060 + (local_10a8.tv_nsec + lStack_1058) / 1000000000) -
           local_1080.tv_sec;
      local_10a8.tv_nsec = (local_10a8.tv_nsec + lStack_1058) % 1000000000 - local_1080.tv_nsec;
      if (local_10a8.tv_nsec < 0) {
        local_10a8.tv_sec = local_10a8.tv_sec + local_10a8.tv_nsec / 1000000000 + -1;
        local_10a8.tv_nsec = local_10a8.tv_nsec % 1000000000 + 1000000000;
      }
      plVar6 = &local_10a8.tv_nsec;
      _Var5 = local_10a8.tv_sec;
    }
    else {
      plVar6 = &lStack_1058;
      _Var5 = local_1060;
    }
    if (4.0 < (double)*plVar6 / 1000000000.0 + (double)_Var5) {
      puts("Error reading data from a ublox : Sentence timeout. ");
      return 2;
    }
  } while( true );
}

Assistant:

inline int GetNMEASentenceublox(UBLOX* publox, NMEADATA* pNMEAData)
{
	char recvbuf[MAX_NB_BYTES_UBLOX];
	int BytesReceived = 0, recvbuflen = 0, res = EXIT_FAILURE, nbBytesToRequest = 0, nbBytesDiscarded = 0;
	char* ptr = NULL;
	int sentencelen = 0;
	char talkerid[MAX_NB_BYTES_TALKER_ID_NMEA+1]; // +1 for the null terminator character for strings.
	char mnemonic[MAX_NB_BYTES_MNEMONIC_NMEA+1]; // +1 for the null terminator character for strings.
	CHRONO chrono;

	StartChrono(&chrono);

	// Prepare the buffers.
	memset(recvbuf, 0, sizeof(recvbuf));
	recvbuflen = MAX_NB_BYTES_UBLOX-1; // The last character must be a 0 to be a valid string for sscanf.
	BytesReceived = 0;

	// Suppose that there are not so many data to discard.
	// First try to get directly the desired message...

	nbBytesToRequest = MIN_NB_BYTES_SENTENCE_NMEA;
	if (ReadAllRS232Port(&publox->RS232Port, (uint8*)recvbuf, nbBytesToRequest) != EXIT_SUCCESS)
	{
		printf("Error reading data from a ublox. \n");
		return EXIT_FAILURE;
	}
	if ((publox->bSaveRawData)&&(publox->pfSaveFile))
	{
		fwrite(recvbuf, nbBytesToRequest, 1, publox->pfSaveFile);
		fflush(publox->pfSaveFile);
	}
	BytesReceived += nbBytesToRequest;
	
	for (;;)
	{
		memset(talkerid, 0, sizeof(talkerid));
		memset(mnemonic, 0, sizeof(mnemonic));
		res = FindSentenceNMEA(recvbuf, BytesReceived, talkerid, mnemonic, &sentencelen, &nbBytesToRequest, &ptr, &nbBytesDiscarded);
		if (res == EXIT_SUCCESS) break;
		if (res == EXIT_FAILURE)
		{
			nbBytesToRequest = min(MIN_NB_BYTES_SENTENCE_NMEA, nbBytesDiscarded);
		}	
		memmove(recvbuf, recvbuf+nbBytesDiscarded, BytesReceived-nbBytesDiscarded);
		BytesReceived -= nbBytesDiscarded;
		if (BytesReceived+nbBytesToRequest > recvbuflen)
		{
			printf("Error reading data from a ublox : Invalid data. \n");
			return EXIT_INVALID_DATA;
		}
		if (ReadAllRS232Port(&publox->RS232Port, (uint8*)recvbuf+BytesReceived, nbBytesToRequest) != EXIT_SUCCESS)
		{
			printf("Error reading data from a ublox. \n");
			return EXIT_FAILURE;
		}
		if ((publox->bSaveRawData)&&(publox->pfSaveFile))
		{
			fwrite(recvbuf+BytesReceived, nbBytesToRequest, 1, publox->pfSaveFile);
			fflush(publox->pfSaveFile);
		}
		BytesReceived += nbBytesToRequest;
		if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_UBLOX)
		{
			printf("Error reading data from a ublox : Sentence timeout. \n");
			return EXIT_TIMEOUT;
		}
	}

	if (BytesReceived-nbBytesDiscarded-sentencelen > 0)
	{
		printf("Warning getting data from a ublox : Unexpected data after a sentence. \n");
	}

	//// Get data bytes.

	//memset(databuf, 0, databuflen);

	//// Check the number of data bytes before copy.
	//if (databuflen < *psentencelen)
	//{
	//	printf("Error getting data from a ublox : Too small data buffer. \n");
	//	return EXIT_FAILURE;
	//}

	//// Copy the data bytes of the message.
	//if (*psentencelen > 0)
	//{
	//	memcpy(databuf, ptr, *psentencelen);
	//}

	if (ProcessSentenceNMEA(ptr, sentencelen, talkerid, mnemonic, pNMEAData) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	return EXIT_SUCCESS;
}